

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O1

ChVector<double> * __thiscall
chrono::ChFrameMoving<double>::GetWacc_loc(ChFrameMoving<double> *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  ChVector<double> *in_RDI;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  dVar1 = (this->super_ChFrame<double>).coord.rot.m_data[0];
  dVar2 = (this->super_ChFrame<double>).coord.rot.m_data[1];
  dVar1 = dVar1 + dVar1;
  dVar2 = dVar2 + dVar2;
  dVar3 = (this->super_ChFrame<double>).coord.rot.m_data[2];
  dVar3 = dVar3 + dVar3;
  dVar4 = (this->super_ChFrame<double>).coord.rot.m_data[3];
  dVar4 = dVar4 + dVar4;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = (this->coord_dtdt).rot.m_data[0];
  dVar5 = (this->coord_dtdt).rot.m_data[1];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar2;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar1 * dVar5;
  auVar14 = vfnmadd231sd_fma(auVar14,auVar8,auVar13);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = (this->coord_dtdt).rot.m_data[2];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar4;
  auVar14 = vfmadd231sd_fma(auVar14,auVar12,auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = (this->coord_dtdt).rot.m_data[3];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar3;
  auVar6 = vfnmadd231sd_fma(auVar14,auVar10,auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar5 * dVar4;
  auVar14 = vfnmsub231sd_fma(auVar17,auVar10,auVar13);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar1;
  auVar14 = vfmadd231sd_fma(auVar14,auVar7,auVar15);
  auVar14 = vfmadd231sd_fma(auVar14,auVar8,auVar16);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar3 * dVar5;
  auVar8 = vfnmadd231sd_fma(auVar11,auVar12,auVar13);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar2;
  auVar8 = vfnmadd231sd_fma(auVar8,auVar9,auVar15);
  auVar8 = vfmadd231sd_fma(auVar8,auVar7,auVar16);
  in_RDI->m_data[0] = auVar6._0_8_;
  in_RDI->m_data[1] = auVar14._0_8_;
  in_RDI->m_data[2] = auVar8._0_8_;
  return in_RDI;
}

Assistant:

ChVector<Real> GetWacc_loc() const {
        ChGlMatrix34<> Gl(this->coord.rot);
        return Gl * coord_dtdt.rot;
    }